

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O2

leveldb_comparator_t *
leveldb_comparator_create
          (void *state,_func_void_void_ptr *destructor,
          _func_int_void_ptr_char_ptr_size_t_char_ptr_size_t *compare,_func_char_ptr_void_ptr *name)

{
  leveldb_comparator_t *plVar1;
  
  plVar1 = (leveldb_comparator_t *)operator_new(0x28);
  (plVar1->super_Comparator)._vptr_Comparator = (_func_int **)&PTR__leveldb_comparator_t_00133138;
  plVar1->state_ = state;
  plVar1->destructor_ = destructor;
  plVar1->compare_ = compare;
  plVar1->name_ = name;
  return plVar1;
}

Assistant:

leveldb_comparator_t* leveldb_comparator_create(
    void* state, void (*destructor)(void*),
    int (*compare)(void*, const char* a, size_t alen, const char* b,
                   size_t blen),
    const char* (*name)(void*)) {
  leveldb_comparator_t* result = new leveldb_comparator_t;
  result->state_ = state;
  result->destructor_ = destructor;
  result->compare_ = compare;
  result->name_ = name;
  return result;
}